

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O2

int VP8LDecodeImage(VP8LDecoder *dec)

{
  int src_height;
  int dst_width;
  int dst_height;
  VP8Io *io;
  undefined8 *puVar1;
  VP8StatusCode VVar2;
  int iVar3;
  WEBP_CSP_MODE WVar4;
  WebPRescaler *rescaler;
  VP8StatusCode VVar5;
  
  if (dec == (VP8LDecoder *)0x0) {
    return 0;
  }
  io = dec->io;
  puVar1 = (undefined8 *)io->opaque;
  if (dec->state == READ_DATA) {
LAB_00109eb5:
    iVar3 = DecodeImageData(dec,dec->pixels,dec->width,dec->height,io->crop_bottom,ProcessRows);
    if (iVar3 != 0) {
      *(int *)(puVar1 + 4) = dec->last_out_row;
      return 1;
    }
  }
  else {
    dec->output = (WebPDecBuffer *)*puVar1;
    iVar3 = WebPIoInitFromOptions((WebPDecoderOptions *)puVar1[5],io,MODE_BGRA);
    if (iVar3 == 0) {
      VVar5 = dec->status;
      VVar2 = VP8_STATUS_INVALID_PARAM;
    }
    else {
      iVar3 = AllocateInternalBuffers32b(dec,io->width);
      if (iVar3 == 0) goto LAB_00109f0a;
      if (io->use_scaling == 0) {
LAB_00109e4b:
        WVar4 = dec->output->colorspace;
        if (0xfffffffb < WVar4 - MODE_YUV) {
LAB_00109e59:
          WebPInitAlphaProcessing();
          WVar4 = dec->output->colorspace;
        }
        if ((MODE_rgbA_4444 < WVar4) &&
           (WebPInitConvertARGBToYUV(), (dec->output->u).YUVA.a != (uint8_t *)0x0)) {
          WebPInitAlphaProcessing();
        }
        if ((((dec->incremental == 0) || ((dec->hdr).color_cache_size < 1)) ||
            ((dec->hdr).saved_color_cache.colors != (uint32_t *)0x0)) ||
           (iVar3 = VP8LColorCacheInit(&(dec->hdr).saved_color_cache,
                                       (dec->hdr).color_cache.hash_bits), iVar3 != 0)) {
          dec->state = READ_DATA;
          goto LAB_00109eb5;
        }
      }
      else {
        iVar3 = io->mb_w;
        src_height = io->mb_h;
        dst_width = io->scaled_width;
        dst_height = io->scaled_height;
        rescaler = (WebPRescaler *)WebPSafeMalloc((long)dst_width * 0x24 + 0x68,1);
        if (rescaler != (WebPRescaler *)0x0) {
          dec->rescaler_memory = (uint8_t *)rescaler;
          dec->rescaler = rescaler;
          iVar3 = WebPRescalerInit(rescaler,iVar3,src_height,
                                   (uint8_t *)(&rescaler[1].x_expand + (long)dst_width * 8),
                                   dst_width,dst_height,0,4,(rescaler_t *)(rescaler + 1));
          if (iVar3 == 0) goto LAB_00109f0a;
          if (io->use_scaling == 0) goto LAB_00109e4b;
          goto LAB_00109e59;
        }
      }
      VVar5 = dec->status;
      VVar2 = VP8_STATUS_OUT_OF_MEMORY;
    }
    if ((VVar5 == VP8_STATUS_OK) || (VVar5 == VP8_STATUS_SUSPENDED)) {
      dec->status = VVar2;
    }
  }
LAB_00109f0a:
  VP8LClear(dec);
  return 0;
}

Assistant:

int VP8LDecodeImage(VP8LDecoder* const dec) {
  VP8Io* io = NULL;
  WebPDecParams* params = NULL;

  if (dec == NULL) return 0;

  assert(dec->hdr.huffman_tables.root.start != NULL);
  assert(dec->hdr.htree_groups != NULL);
  assert(dec->hdr.num_htree_groups > 0);

  io = dec->io;
  assert(io != NULL);
  params = (WebPDecParams*)io->opaque;
  assert(params != NULL);

  // Initialization.
  if (dec->state != READ_DATA) {
    dec->output = params->output;
    assert(dec->output != NULL);

    if (!WebPIoInitFromOptions(params->options, io, MODE_BGRA)) {
      VP8LSetError(dec, VP8_STATUS_INVALID_PARAM);
      goto Err;
    }

    if (!AllocateInternalBuffers32b(dec, io->width)) goto Err;

#if !defined(WEBP_REDUCE_SIZE)
    if (io->use_scaling && !AllocateAndInitRescaler(dec, io)) goto Err;
#else
    if (io->use_scaling) {
      VP8LSetError(dec, VP8_STATUS_INVALID_PARAM);
      goto Err;
    }
#endif
    if (io->use_scaling || WebPIsPremultipliedMode(dec->output->colorspace)) {
      // need the alpha-multiply functions for premultiplied output or rescaling
      WebPInitAlphaProcessing();
    }

    if (!WebPIsRGBMode(dec->output->colorspace)) {
      WebPInitConvertARGBToYUV();
      if (dec->output->u.YUVA.a != NULL) WebPInitAlphaProcessing();
    }
    if (dec->incremental) {
      if (dec->hdr.color_cache_size > 0 &&
          dec->hdr.saved_color_cache.colors == NULL) {
        if (!VP8LColorCacheInit(&dec->hdr.saved_color_cache,
                                dec->hdr.color_cache.hash_bits)) {
          VP8LSetError(dec, VP8_STATUS_OUT_OF_MEMORY);
          goto Err;
        }
      }
    }
    dec->state = READ_DATA;
  }

  // Decode.
  if (!DecodeImageData(dec, dec->pixels, dec->width, dec->height,
                       io->crop_bottom, ProcessRows)) {
    goto Err;
  }

  params->last_y = dec->last_out_row;
  return 1;

 Err:
  VP8LClear(dec);
  assert(dec->status != VP8_STATUS_OK);
  return 0;
}